

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.cpp
# Opt level: O1

int duckdb_miniz::mz_inflateEnd(mz_streamp pStream)

{
  int iVar1;
  
  if (pStream == (mz_streamp)0x0) {
    iVar1 = -2;
  }
  else {
    iVar1 = 0;
    if (pStream->state != (mz_internal_state *)0x0) {
      (*pStream->zfree)(pStream->opaque,pStream->state);
      pStream->state = (mz_internal_state *)0x0;
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

int mz_inflateEnd(mz_streamp pStream)
{
    if (!pStream)
        return MZ_STREAM_ERROR;
    if (pStream->state)
    {
        pStream->zfree(pStream->opaque, pStream->state);
        pStream->state = NULL;
    }
    return MZ_OK;
}